

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

void __thiscall
Js::JavascriptMap::MarkVisitKindSpecificPtrs(JavascriptMap *this,SnapshotExtractor *extractor)

{
  Type *addr;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar1;
  bool bVar2;
  undefined1 local_40 [8];
  Iterator iterator;
  
  Memory::Recycler::WBSetBit((char *)local_40);
  local_40 = (undefined1  [8])&this->list;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((Iterator *)local_40);
  iterator.list.ptr =
       (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)0x0;
  bVar2 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          ::Iterator::Next((Iterator *)local_40);
  if (bVar2) {
    addr = &iterator.current;
    do {
      pMVar1 = iterator.list.ptr[1].first.ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      iterator.current.ptr = pMVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      TTD::SnapshotExtractor::MarkVisitVar(extractor,iterator.current.ptr);
      pMVar1 = iterator.list.ptr[1].last.ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      iterator.current.ptr = pMVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      TTD::SnapshotExtractor::MarkVisitVar(extractor,iterator.current.ptr);
      bVar2 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              ::Iterator::Next((Iterator *)local_40);
    } while (bVar2);
  }
  return;
}

Assistant:

void JavascriptMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
{
    auto iterator = GetIterator();
    while(iterator.Next())
    {
        extractor->MarkVisitVar(iterator.Current().Key());
        extractor->MarkVisitVar(iterator.Current().Value());
    }
}